

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int LoadEXRMultipartImageFromMemory
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar *memory,char **err)

{
  pointer puVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  size_t i;
  long *plVar10;
  ulong uVar11;
  bool bVar12;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> offset_table;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  chunk_offset_table_list;
  allocator_type local_71;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_70;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_58;
  EXRImage *local_38;
  
  if ((memory == (uchar *)0x0 || num_parts == 0) ||
      (exr_headers == (EXRHeader **)0x0 || exr_images == (EXRImage *)0x0)) {
    iVar8 = -3;
    if (err != (char **)0x0) {
      pcVar3 = "Invalid argument.";
LAB_0012c147:
      iVar8 = -3;
      *err = pcVar3;
    }
  }
  else {
    uVar11 = (ulong)num_parts;
    uVar5 = 0;
    lVar4 = 0;
    do {
      if ((ulong)exr_headers[uVar5]->header_len == 0) {
        if (err == (char **)0x0) {
          return -3;
        }
        pcVar3 = "EXRHeader is not initialized.";
        goto LAB_0012c147;
      }
      lVar4 = lVar4 + (ulong)exr_headers[uVar5]->header_len;
      uVar5 = uVar5 + 1;
    } while (uVar11 != uVar5);
    local_58.
    super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38 = exr_images;
    if (num_parts != 0) {
      plVar10 = (long *)(memory + lVar4 + 9);
      uVar5 = 0;
      do {
        std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
                  (&local_70,(long)exr_headers[uVar5]->chunk_count,&local_71);
        if ((long)local_70.
                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_70.
                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0) {
          lVar4 = (long)local_70.
                        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_70.
                        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3;
          lVar6 = 0;
          do {
            local_70.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar6] = *plVar10 + 4;
            plVar10 = plVar10 + 1;
            lVar6 = lVar6 + 1;
          } while (lVar4 + (ulong)(lVar4 == 0) != lVar6);
        }
        std::
        vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
        ::push_back(&local_58,&local_70);
        if (local_70.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_70.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_70.
                                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_70.
                                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar11);
      iVar8 = -3;
      uVar5 = 0;
      do {
        puVar1 = local_58.
                 super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5].
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
                 .super__Vector_impl_data._M_start;
        lVar4 = (long)local_58.
                      super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar5].
                      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
        bVar12 = lVar4 != 0;
        if (bVar12) {
          uVar7 = lVar4 >> 3;
          if (uVar5 == *(uint *)(memory + (*puVar1 - 4))) {
            uVar2 = 1;
            do {
              uVar9 = uVar2;
              if (uVar7 + (uVar7 == 0) == uVar9) goto LAB_0012c0f4;
              uVar2 = uVar9 + 1;
            } while (uVar5 == *(uint *)(memory + (puVar1[uVar9] - 4)));
            iVar8 = -4;
LAB_0012c0f4:
            bVar12 = uVar9 < uVar7;
          }
          else {
            iVar8 = -4;
          }
        }
        if (bVar12) goto LAB_0012c12a;
        tinyexr::DecodeChunk
                  (local_38 + uVar5,exr_headers[uVar5],
                   local_58.
                   super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar5,memory);
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar11);
    }
    iVar8 = 0;
LAB_0012c12a:
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::~vector(&local_58);
  }
  return iVar8;
}

Assistant:

int LoadEXRMultipartImageFromMemory(EXRImage *exr_images,
                                    const EXRHeader **exr_headers,
                                    unsigned int num_parts,
                                    const unsigned char *memory,
                                    const char **err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  // compute total header size.
  size_t total_header_size = 0;
  for (unsigned int i = 0; i < num_parts; i++) {
    if (exr_headers[i]->header_len == 0) {
      if (err) {
        (*err) = "EXRHeader is not initialized.";
      }
      return TINYEXR_ERROR_INVALID_ARGUMENT;
    }

    total_header_size += exr_headers[i]->header_len;
  }

  const char *marker = reinterpret_cast<const char *>(
      memory + total_header_size + 4 +
      4);  // +8 for magic number and version header.

  marker += 1;  // Skip empty header.

  // NOTE 1:
  //   In multipart image, There is 'part number' before chunk data.
  //   4 byte : part number
  //   4+     : chunk
  //
  // NOTE 2:
  //   EXR spec says 'part number' is 'unsigned long' but actually this is
  //   'unsigned int(4 bytes)' in OpenEXR implementation...
  //   http://www.openexr.com/openexrfilelayout.pdf

  // Load chunk offset table.
  std::vector<std::vector<unsigned long long> > chunk_offset_table_list;
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    std::vector<unsigned long long> offset_table(
        static_cast<size_t>(exr_headers[i]->chunk_count));

    for (size_t c = 0; c < offset_table.size(); c++) {
      unsigned long long offset;
      memcpy(&offset, marker, 8);
      tinyexr::swap8(&offset);

      offset_table[c] = offset + 4;  // +4 to skip 'part number'
      marker += 8;
    }

    chunk_offset_table_list.push_back(offset_table);
  }

  // Decode image.
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    std::vector<unsigned long long> &offset_table = chunk_offset_table_list[i];

    // First check 'part number' is identitical to 'i'
    for (size_t c = 0; c < offset_table.size(); c++) {
      const unsigned char *part_number_addr =
          memory + offset_table[c] - 4;  // -4 to move to 'part number' field.
      unsigned int part_no;
      memcpy(&part_no, part_number_addr, sizeof(unsigned int));  // 4
      tinyexr::swap4(&part_no);

      if (part_no != i) {
        assert(0);
        return TINYEXR_ERROR_INVALID_DATA;
      }
    }

    int ret = tinyexr::DecodeChunk(&exr_images[i], exr_headers[i], offset_table,
                                   memory);
    if (ret != TINYEXR_SUCCESS) {
      return ret;
    }
  }

  return TINYEXR_SUCCESS;
}